

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O2

int ndn_unix_face_up(ndn_face_intf *self)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = socket(1,1,0);
  *(int *)&self[4].up = iVar1;
  if (iVar1 != -1) {
    uVar2 = fcntl(iVar1,3,0);
    if ((uVar2 != 0xffffffff) &&
       (iVar1 = fcntl(*(int *)&self[4].up,4,(ulong)(uVar2 | 0x800)), iVar1 != -1)) {
      return 0;
    }
    (*self->down)(self);
  }
  return 2;
}

Assistant:

static int
ndn_unix_face_up(struct ndn_face_intf* self){
  ndn_unix_face_t* ptr = container_of(self, ndn_unix_face_t, intf);
  int iflags;

  ptr->sock = socket(AF_UNIX, SOCK_STREAM, 0);
  if(ptr->sock == -1){
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }

  iflags = fcntl(ptr->sock, F_GETFL, 0);
  if(iflags == -1){
    ndn_face_down(self);
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }
  if(fcntl(ptr->sock, F_SETFL, iflags | O_NONBLOCK) == -1){
    ndn_face_down(self);
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }

  return NDN_SUCCESS;
}